

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yabmp_stream.h
# Opt level: O2

yabmp_status yabmp_stream_read_le_32u(yabmp *instance,yabmp_uint32 *value)

{
  uint __line;
  size_t sVar1;
  char *__assertion;
  
  if (value == (yabmp_uint32 *)0x0) {
    __assertion = "value != NULL";
    __line = 0x68;
  }
  else {
    if (instance->read_fn != (yabmp_stream_read_cb)0x0) {
      sVar1 = (*instance->read_fn)(instance->stream_context,value,4);
      if (sVar1 == 4) {
        instance->stream_offset = instance->stream_offset + 4;
      }
      return (uint)(sVar1 != 4);
    }
    __assertion = "instance->read_fn != NULL";
    __line = 0x69;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/mayeut[P]yabmp/lib/yabmp/src/../inc/private/yabmp_stream.h"
                ,__line,"yabmp_status yabmp_stream_read_le_32u(yabmp *, yabmp_uint32 *)");
}

Assistant:

YABMP_UNUSED
static yabmp_status yabmp_stream_read_le_32u(yabmp* instance, yabmp_uint32* value)
{
	yabmp_status l_status = YABMP_OK;
	
	assert(instance != NULL);
	assert(value != NULL);
	assert(instance->read_fn != NULL);
	/* if we're on a little endian machine, just read directly */
	if (instance->read_fn(instance->stream_context, value, 4U) != 4U) {
		l_status = YABMP_ERR_UNKNOW;
	} else {
		instance->stream_offset += 4U;
#if defined(YABMP_BIG_ENDIAN)
		*value = yabmp_bswap32(*value);
#endif
	}
	return l_status;
}